

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall wabt::interp::Thread::DoConvert<int,float>(Thread *this,Ptr *out_trap)

{
  float val;
  int value;
  char *pcVar1;
  Store *store;
  Value VVar2;
  allocator local_69;
  Ptr local_68;
  string local_48;
  
  VVar2 = Pop(this);
  val = (float)VVar2.f32_;
  if (NAN(val)) {
    store = this->store_;
    pcVar1 = "invalid conversion to integer";
  }
  else {
    if ((-2.1474836e+09 <= val) && (val < 2.1474836e+09)) {
      value = Convert<int,float>(val);
      Push<int>(this,value);
      return Ok;
    }
    store = this->store_;
    pcVar1 = "integer overflow";
  }
  std::__cxx11::string::string((string *)&local_48,pcVar1,&local_69);
  Trap::New(&local_68,store,&local_48,&this->frames_);
  out_trap->obj_ = local_68.obj_;
  out_trap->store_ = local_68.store_;
  out_trap->root_index_ = local_68.root_index_;
  local_68.obj_ = (Trap *)0x0;
  local_68.store_ = (Store *)0x0;
  local_68.root_index_ = 0;
  RefPtr<wabt::interp::Trap>::reset(&local_68);
  std::__cxx11::string::_M_dispose();
  return Trap;
}

Assistant:

RunResult Thread::DoConvert(Trap::Ptr* out_trap) {
  auto val = Pop<T>();
  if (std::is_integral<R>::value && std::is_floating_point<T>::value) {
    // Don't use std::isnan here because T may be a non-floating-point type.
    TRAP_IF(IsNaN(val), "invalid conversion to integer");
  }
  TRAP_UNLESS(CanConvert<R>(val), "integer overflow");
  Push<R>(Convert<R>(val));
  return RunResult::Ok;
}